

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall
llvm::detail::DoubleAPFloat::DoubleAPFloat
          (DoubleAPFloat *this,fltSemantics *S,APFloat *First,APFloat *Second)

{
  undefined8 *puVar1;
  type pAVar2;
  fltSemantics *pfVar3;
  APFloat *Second_local;
  APFloat *First_local;
  fltSemantics *S_local;
  DoubleAPFloat *this_local;
  
  this->Semantics = S;
  puVar1 = (undefined8 *)operator_new__(0x48);
  *puVar1 = 2;
  APFloat::APFloat((APFloat *)(puVar1 + 1),First);
  APFloat::APFloat((APFloat *)(puVar1 + 5),Second);
  std::unique_ptr<llvm::APFloat[],std::default_delete<llvm::APFloat[]>>::
  unique_ptr<llvm::APFloat*,std::default_delete<llvm::APFloat[]>,void,bool>
            ((unique_ptr<llvm::APFloat[],std::default_delete<llvm::APFloat[]>> *)&this->Floats,
             (APFloat *)(puVar1 + 1));
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xf28,
                  "llvm::detail::DoubleAPFloat::DoubleAPFloat(const fltSemantics &, APFloat &&, APFloat &&)"
                 );
  }
  pAVar2 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     (&this->Floats,0);
  pfVar3 = APFloat::getSemantics(pAVar2);
  if (pfVar3 == (fltSemantics *)semIEEEdouble) {
    pAVar2 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&this->Floats,1);
    pfVar3 = APFloat::getSemantics(pAVar2);
    if (pfVar3 == (fltSemantics *)semIEEEdouble) {
      return;
    }
    __assert_fail("&Floats[1].getSemantics() == &semIEEEdouble",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xf2a,
                  "llvm::detail::DoubleAPFloat::DoubleAPFloat(const fltSemantics &, APFloat &&, APFloat &&)"
                 );
  }
  __assert_fail("&Floats[0].getSemantics() == &semIEEEdouble",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xf29,
                "llvm::detail::DoubleAPFloat::DoubleAPFloat(const fltSemantics &, APFloat &&, APFloat &&)"
               );
}

Assistant:

DoubleAPFloat::DoubleAPFloat(const fltSemantics &S, APFloat &&First,
                             APFloat &&Second)
    : Semantics(&S),
      Floats(new APFloat[2]{std::move(First), std::move(Second)}) {
  assert(Semantics == &semPPCDoubleDouble);
  assert(&Floats[0].getSemantics() == &semIEEEdouble);
  assert(&Floats[1].getSemantics() == &semIEEEdouble);
}